

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O3

bool libtorrent::anon_unknown_10::bittyrant_unchoke_compare
               (peer_connection *lhs,peer_connection *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  lVar1 = (lhs->m_statistics).m_stat[2].m_total_counter;
  lVar2 = lhs->m_downloaded_at_last_round;
  lVar3 = (rhs->m_statistics).m_stat[2].m_total_counter;
  lVar4 = rhs->m_downloaded_at_last_round;
  lVar8 = (lhs->m_statistics).m_stat[0].m_total_counter - lhs->m_uploaded_at_last_round;
  lVar9 = (rhs->m_statistics).m_stat[0].m_total_counter - rhs->m_uploaded_at_last_round;
  iVar6 = peer_connection::get_priority(lhs,0);
  iVar7 = peer_connection::get_priority(rhs,0);
  if (lVar8 < 2) {
    lVar8 = 1;
  }
  lVar8 = ((long)iVar6 * (lVar1 - lVar2) * 1000) / lVar8;
  if (lVar9 < 2) {
    lVar9 = 1;
  }
  lVar9 = ((long)iVar7 * (lVar3 - lVar4) * 1000) / lVar9;
  if (lVar8 == lVar9) {
    bVar5 = (lhs->m_last_unchoke).__d.__r < (rhs->m_last_unchoke).__d.__r;
  }
  else {
    bVar5 = lVar9 < lVar8;
  }
  return bVar5;
}

Assistant:

bool bittyrant_unchoke_compare(peer_connection const* lhs
		, peer_connection const* rhs)
	{
		// first compare how many bytes they've sent us
		std::int64_t d1 = lhs->downloaded_in_last_round();
		std::int64_t d2 = rhs->downloaded_in_last_round();
		// divided by the number of bytes we've sent them
		std::int64_t const u1 = lhs->uploaded_in_last_round();
		std::int64_t const u2 = rhs->uploaded_in_last_round();

		// take torrent priority into account
		d1 *= lhs->get_priority(peer_connection::upload_channel);
		d2 *= rhs->get_priority(peer_connection::upload_channel);

		d1 = d1 * 1000 / std::max(std::int64_t(1), u1);
		d2 = d2 * 1000 / std::max(std::int64_t(1), u2);
		if (d1 != d2) return d1 > d2;

		// if both peers are still in their send quota or not in their send quota
		// prioritize the one that has waited the longest to be unchoked
		return lhs->time_of_last_unchoke() < rhs->time_of_last_unchoke();
	}